

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_append_text_char(nk_str *s,char *str,int len)

{
  int iVar1;
  void *dst0;
  char *mem;
  int len_local;
  char *str_local;
  nk_str *s_local;
  
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x207a,"int nk_str_append_text_char(struct nk_str *, const char *, int)");
  }
  if (str != (char *)0x0) {
    if (((s == (nk_str *)0x0) || (str == (char *)0x0)) || (len == 0)) {
      s_local._4_4_ = 0;
    }
    else {
      dst0 = nk_buffer_alloc(&s->buffer,NK_BUFFER_FRONT,(long)len,0);
      if (dst0 == (void *)0x0) {
        s_local._4_4_ = 0;
      }
      else {
        nk_memcopy(dst0,str,(long)len);
        iVar1 = nk_utf_len(str,len);
        s->len = iVar1 + s->len;
        s_local._4_4_ = len;
      }
    }
    return s_local._4_4_;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x207b,"int nk_str_append_text_char(struct nk_str *, const char *, int)");
}

Assistant:

NK_API int
nk_str_append_text_char(struct nk_str *s, const char *str, int len)
{
    char *mem;
    NK_ASSERT(s);
    NK_ASSERT(str);
    if (!s || !str || !len) return 0;
    mem = (char*)nk_buffer_alloc(&s->buffer, NK_BUFFER_FRONT, (nk_size)len * sizeof(char), 0);
    if (!mem) return 0;
    NK_MEMCPY(mem, str, (nk_size)len * sizeof(char));
    s->len += nk_utf_len(str, len);
    return len;
}